

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples-array.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSamplesOfArray
          (AsciiParser *this,string *type_name,TimeSamples *ts_out)

{
  bool bVar1;
  uint64_t pos;
  int iVar2;
  char sep;
  char nc;
  char c;
  double timeVal;
  uint64_t local_80;
  TimeSamples ts;
  storage_union local_50;
  undefined **local_40;
  
  ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  ts._17_8_ = 0;
  ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  bVar1 = Expect(this,'{');
  if ((bVar1) && (bVar1 = SkipWhitespaceAndNewline(this,true), bVar1)) {
    do {
      bVar1 = Eof(this);
      if (bVar1) goto LAB_002fe43a;
      bVar1 = Char1(this,&c);
      if (!bVar1) goto LAB_002fe47d;
      if (c == '}') goto LAB_002fe43a;
      Rewind(this,1);
      bVar1 = ReadBasicType(this,&timeVal);
      if (!bVar1) {
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Parse time value failed.",(allocator *)&sep);
        PushError(this,(string *)&local_50);
        ::std::__cxx11::string::_M_dispose();
        goto LAB_002fe47d;
      }
      bVar1 = SkipWhitespace(this);
      if (((!bVar1) || (bVar1 = Expect(this,':'), !bVar1)) || (bVar1 = SkipWhitespace(this), !bVar1)
         ) goto LAB_002fe47d;
      local_40 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_50.dynamic = (void *)0x0;
      bVar1 = ParseTimeSampleValueOfArrayType(this,type_name,(Value *)&local_50);
      iVar2 = 1;
      if ((bVar1) && (bVar1 = SkipWhitespace(this), bVar1)) {
        sep = '\0';
        bVar1 = Char1(this,&sep);
        if (bVar1) {
          if (sep != ',') {
            if (sep == '}') {
LAB_002fe389:
              tinyusdz::value::TimeSamples::add_sample(&ts,timeVal,(Value *)&local_50);
              iVar2 = 3;
              goto LAB_002fe41d;
            }
            Rewind(this,1);
            pos = CurrLoc(this);
            bVar1 = SkipWhitespaceAndNewline(this,true);
            if (bVar1) {
              local_80 = pos;
              bVar1 = Char1(this,&nc);
              if (!bVar1) goto LAB_002fe41d;
              pos = local_80;
              if (nc == '}') goto LAB_002fe389;
            }
            SeekTo(this,pos);
          }
          bVar1 = SkipWhitespaceAndNewline(this,true);
          if (bVar1) {
            tinyusdz::value::TimeSamples::add_sample(&ts,timeVal,(Value *)&local_50);
            iVar2 = 0;
          }
        }
      }
LAB_002fe41d:
      if (local_40 != (undefined **)0x0) {
        (*(code *)local_40[4])(&local_50);
      }
    } while (iVar2 == 0);
    if (iVar2 == 3) {
LAB_002fe43a:
      bVar1 = true;
      if (ts_out != (TimeSamples *)0x0) {
        tinyusdz::value::TimeSamples::operator=(ts_out,&ts);
      }
      goto LAB_002fe47f;
    }
  }
LAB_002fe47d:
  bVar1 = false;
LAB_002fe47f:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&ts._samples);
  return bVar1;
}

Assistant:

bool AsciiParser::ParseTimeSamplesOfArray(const std::string &type_name,
                                   value::TimeSamples *ts_out) {

  value::TimeSamples ts;

  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    }

    Rewind(1);

    double timeVal;
    // -inf, inf and nan are handled.
    if (!ReadBasicType(&timeVal)) {
      PushError("Parse time value failed.");
      return false;
    }

    if (!SkipWhitespace()) {
      return false;
    }

    if (!Expect(':')) {
      return false;
    }

    if (!SkipWhitespace()) {
      return false;
    }

    value::Value value;
    if (!ParseTimeSampleValueOfArrayType(type_name, &value)) { // could be None(ValueBlock)
      return false;
    }

    // The last element may have separator ','
    {
      // Semicolon ';' is not allowed as a separator for timeSamples array
      // values.
      if (!SkipWhitespace()) {
        return false;
      }

      char sep{};
      if (!Char1(&sep)) {
        return false;
      }

      DCOUT("sep = " << sep);
      if (sep == '}') {
        // End of item
        ts.add_sample(timeVal, value);
        break;
      } else if (sep == ',') {
        // ok
      } else {
        Rewind(1);

        // Look ahead Newline + '}'
        auto loc = CurrLoc();

        if (SkipWhitespaceAndNewline()) {
          char nc;
          if (!Char1(&nc)) {
            return false;
          }

          if (nc == '}') {
            // End of item
            ts.add_sample(timeVal, value);
            break;
          }
        }

        // Rewind and continue parsing.
        SeekTo(loc);
      }
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    ts.add_sample(timeVal, value);
  }

  DCOUT("Parse TimeSamples success. # of items = " << ts.size());

  if (ts_out) {
    (*ts_out) = std::move(ts);
  }

  return true;
}